

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O2

void __thiscall FIX50::MarketDataRequest::NoMDEntryTypes::NoMDEntryTypes(NoMDEntryTypes *this)

{
  message_order local_30 [8];
  shared_array<int> local_28 [24];
  
  FIX::message_order::message_order(local_30,0x10d,0);
  FIX::Group::Group(&this->super_Group,0x10b,0x10d,local_30);
  FIX::shared_array<int>::~shared_array(local_28);
  *(undefined ***)&this->super_Group = &PTR__FieldMap_001590e8;
  return;
}

Assistant:

NoMDEntryTypes() : FIX::Group(267,269,FIX::message_order(269,0)) {}